

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_CDict *
ZSTD_initStaticCDict
          (void *workspace,size_t workspaceSize,void *dict,size_t dictSize,
          ZSTD_dictLoadMethod_e dictLoadMethod,ZSTD_dictContentType_e dictContentType,
          ZSTD_compressionParameters cParams)

{
  ZSTD_CCtx_params params_00;
  ZSTD_paramSwitch_e ZVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  long lVar7;
  undefined8 in_RDX;
  ulong in_RSI;
  undefined8 *puVar8;
  ulong in_RDI;
  undefined8 *puVar9;
  int in_R8D;
  byte bVar10;
  ZSTD_cwksp ws;
  ZSTD_CCtx_params params;
  ZSTD_CDict *cdict;
  size_t neededSize;
  size_t matchStateSize;
  ZSTD_paramSwitch_e useRowMatchFinder;
  undefined4 in_stack_fffffffffffffd88;
  ZSTD_cwksp_static_alloc_e in_stack_fffffffffffffd8c;
  ZSTD_paramSwitch_e in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  void *in_stack_fffffffffffffd98;
  ZSTD_cwksp *in_stack_fffffffffffffda0;
  ZSTD_cwksp *in_stack_fffffffffffffda8;
  ZSTD_dictContentType_e in_stack_fffffffffffffe00;
  ZSTD_dictLoadMethod_e in_stack_fffffffffffffe04;
  size_t in_stack_fffffffffffffe08;
  void *in_stack_fffffffffffffe10;
  ZSTD_CDict *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe30;
  U32 in_stack_fffffffffffffe34;
  U32 in_stack_fffffffffffffe38;
  ZSTD_paramSwitch_e in_stack_fffffffffffffe3c;
  ZSTD_compressionParameters *in_stack_fffffffffffffe40;
  undefined1 auVar11 [12];
  undefined1 in_stack_fffffffffffffe48 [24];
  ZSTD_CDict *pZVar12;
  undefined4 in_stack_fffffffffffffe70;
  size_t sVar13;
  undefined8 *puVar14;
  undefined1 auVar15 [24];
  undefined1 in_stack_fffffffffffffe98 [76];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined4 uVar19;
  ZSTD_CDict *local_8;
  
  bVar10 = 0;
  puVar14 = (undefined8 *)&stack0x00000008;
  ZVar1 = ZSTD_resolveRowMatchFinderMode
                    (in_stack_fffffffffffffd90,
                     (ZSTD_compressionParameters *)
                     CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
  sVar3 = ZSTD_sizeof_matchState
                    (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38,
                     in_stack_fffffffffffffe34);
  sVar4 = ZSTD_cwksp_alloc_size(0x17c0);
  if (in_R8D == 1) {
    sVar13 = 0;
  }
  else {
    sVar13 = ZSTD_cwksp_align(CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                              CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
    sVar13 = ZSTD_cwksp_alloc_size(sVar13);
  }
  lVar5 = sVar4 + sVar13;
  sVar6 = ZSTD_cwksp_alloc_size(0x2200);
  lVar7 = lVar5 + sVar6;
  if ((in_RDI & 7) == 0) {
    ZSTD_cwksp_init(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                    CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                    in_stack_fffffffffffffd8c);
    local_8 = (ZSTD_CDict *)
              ZSTD_cwksp_reserve_object(in_stack_fffffffffffffda8,(size_t)in_stack_fffffffffffffda0)
    ;
    if (local_8 == (ZSTD_CDict *)0x0) {
      local_8 = (ZSTD_CDict *)0x0;
    }
    else {
      ZSTD_cwksp_move((ZSTD_cwksp *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                      (ZSTD_cwksp *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      if (in_RSI < lVar7 + sVar3) {
        local_8 = (ZSTD_CDict *)0x0;
      }
      else {
        ZSTD_CCtxParams_init
                  ((ZSTD_CCtx_params *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88)
                   ,0);
        uVar16 = *puVar14;
        uVar17 = puVar14[1];
        uVar18 = puVar14[2];
        uVar19 = *(undefined4 *)(puVar14 + 3);
        local_8->useRowMatchFinder = ZVar1;
        local_8->compressionLevel = 0;
        puVar8 = (undefined8 *)&stack0xfffffffffffffee0;
        puVar9 = (undefined8 *)&stack0xfffffffffffffd88;
        pZVar12 = local_8;
        for (lVar7 = 0x1a; lVar7 != 0; lVar7 = lVar7 + -1) {
          *puVar9 = *puVar8;
          puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
          puVar9 = puVar9 + (ulong)bVar10 * -2 + 1;
        }
        params_00.cParams.windowLog = in_stack_fffffffffffffe34;
        params_00.format = in_stack_fffffffffffffe30;
        params_00.cParams.chainLog = in_stack_fffffffffffffe38;
        params_00.cParams.hashLog = in_stack_fffffffffffffe3c;
        params_00.cParams._12_8_ = in_stack_fffffffffffffe40;
        auVar11 = in_stack_fffffffffffffe48._8_12_;
        params_00.cParams.targetLength = in_stack_fffffffffffffe48._0_4_;
        params_00.cParams.strategy = in_stack_fffffffffffffe48._4_4_;
        params_00.fParams.contentSizeFlag = auVar11._0_4_;
        params_00.fParams.checksumFlag = auVar11._4_4_;
        params_00.fParams.noDictIDFlag = auVar11._8_4_;
        params_00.compressionLevel = in_stack_fffffffffffffe48._20_4_;
        params_00._48_8_ = in_RDX;
        params_00.targetCBlockSize = (size_t)pZVar12;
        params_00.srcSizeHint = in_stack_fffffffffffffe70;
        params_00.attachDictPref = in_R8D;
        params_00.literalCompressionMode = (int)lVar5;
        params_00.nbWorkers = (int)((ulong)lVar5 >> 0x20);
        params_00.jobSize = sVar13;
        params_00._88_8_ = puVar14;
        params_00.ldmParams.enableLdm = (int)sVar4;
        params_00.ldmParams.hashLog = (int)(sVar4 >> 0x20);
        auVar15 = in_stack_fffffffffffffe98._48_24_;
        params_00.ldmParams.bucketSizeLog = in_stack_fffffffffffffe98._0_4_;
        params_00.ldmParams.minMatchLength = in_stack_fffffffffffffe98._4_4_;
        params_00.ldmParams.hashRateLog = in_stack_fffffffffffffe98._8_4_;
        params_00.ldmParams.windowLog = in_stack_fffffffffffffe98._12_4_;
        params_00.enableDedicatedDictSearch = in_stack_fffffffffffffe98._16_4_;
        params_00.inBufferMode = in_stack_fffffffffffffe98._20_4_;
        params_00.outBufferMode = in_stack_fffffffffffffe98._24_4_;
        params_00.blockDelimiters = in_stack_fffffffffffffe98._28_4_;
        params_00.validateSequences = in_stack_fffffffffffffe98._32_4_;
        params_00.useBlockSplitter = in_stack_fffffffffffffe98._36_4_;
        params_00.useRowMatchFinder = in_stack_fffffffffffffe98._40_4_;
        params_00.deterministicRefPrefix = in_stack_fffffffffffffe98._44_4_;
        params_00.customMem.customAlloc = (ZSTD_allocFunction)auVar15._0_8_;
        params_00.customMem.customFree = (ZSTD_freeFunction)auVar15._8_8_;
        params_00.customMem.opaque = (void *)auVar15._16_8_;
        params_00.prefetchCDictTables = in_stack_fffffffffffffe98._72_4_;
        params_00.enableMatchFinderFallback = (int)uVar16;
        params_00.useSequenceProducer = (int)((ulong)uVar16 >> 0x20);
        params_00._188_8_ = uVar17;
        params_00._196_8_ = uVar18;
        params_00._204_4_ = uVar19;
        ZSTD_initCDict_internal
                  (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                   in_stack_fffffffffffffe04,in_stack_fffffffffffffe00,params_00);
        uVar2 = ZSTD_isError(0x2a8d3d);
        if (uVar2 != 0) {
          local_8 = (ZSTD_CDict *)0x0;
        }
      }
    }
  }
  else {
    local_8 = (ZSTD_CDict *)0x0;
  }
  return local_8;
}

Assistant:

const ZSTD_CDict* ZSTD_initStaticCDict(
                                 void* workspace, size_t workspaceSize,
                           const void* dict, size_t dictSize,
                                 ZSTD_dictLoadMethod_e dictLoadMethod,
                                 ZSTD_dictContentType_e dictContentType,
                                 ZSTD_compressionParameters cParams)
{
    ZSTD_paramSwitch_e const useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(ZSTD_ps_auto, &cParams);
    /* enableDedicatedDictSearch == 1 ensures matchstate is not too small in case this CDict will be used for DDS + row hash */
    size_t const matchStateSize = ZSTD_sizeof_matchState(&cParams, useRowMatchFinder, /* enableDedicatedDictSearch */ 1, /* forCCtx */ 0);
    size_t const neededSize = ZSTD_cwksp_alloc_size(sizeof(ZSTD_CDict))
                            + (dictLoadMethod == ZSTD_dlm_byRef ? 0
                               : ZSTD_cwksp_alloc_size(ZSTD_cwksp_align(dictSize, sizeof(void*))))
                            + ZSTD_cwksp_alloc_size(HUF_WORKSPACE_SIZE)
                            + matchStateSize;
    ZSTD_CDict* cdict;
    ZSTD_CCtx_params params;

    if ((size_t)workspace & 7) return NULL;  /* 8-aligned */

    {
        ZSTD_cwksp ws;
        ZSTD_cwksp_init(&ws, workspace, workspaceSize, ZSTD_cwksp_static_alloc);
        cdict = (ZSTD_CDict*)ZSTD_cwksp_reserve_object(&ws, sizeof(ZSTD_CDict));
        if (cdict == NULL) return NULL;
        ZSTD_cwksp_move(&cdict->workspace, &ws);
    }

    DEBUGLOG(4, "(workspaceSize < neededSize) : (%u < %u) => %u",
        (unsigned)workspaceSize, (unsigned)neededSize, (unsigned)(workspaceSize < neededSize));
    if (workspaceSize < neededSize) return NULL;

    ZSTD_CCtxParams_init(&params, 0);
    params.cParams = cParams;
    params.useRowMatchFinder = useRowMatchFinder;
    cdict->useRowMatchFinder = useRowMatchFinder;
    cdict->compressionLevel = ZSTD_NO_CLEVEL;

    if (ZSTD_isError( ZSTD_initCDict_internal(cdict,
                                              dict, dictSize,
                                              dictLoadMethod, dictContentType,
                                              params) ))
        return NULL;

    return cdict;
}